

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O1

int __thiscall
icu_63::JapaneseCalendar::clone
          (JapaneseCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  JapaneseCalendar *this_00;
  
  this_00 = (JapaneseCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)__fn);
  if (this_00 == (JapaneseCalendar *)0x0) {
    this_00 = (JapaneseCalendar *)0x0;
  }
  else {
    JapaneseCalendar(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Calendar* JapaneseCalendar::clone(void) const
{
    return new JapaneseCalendar(*this);
}